

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<char> s;
  byte bVar1;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *extraout_RAX;
  buffer_appender<char> bVar2;
  size_t unaff_retaddr;
  basic_string_view<char> *in_stack_ffffffffffffffd0;
  bool in_stack_ffffffffffffffe7;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = (byte)__fd & 1;
  if (this->specs_ == (format_specs *)0x0) {
    bVar2 = write<char,fmt::v7::detail::buffer_appender<char>>
                      ((buffer_appender<char>)in_stack_ffffffffffffffe8.container,
                       in_stack_ffffffffffffffe7);
    (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  else {
    basic_string_view<char>::basic_string_view(in_stack_ffffffffffffffd0,(char *)this);
    s.size_ = unaff_retaddr;
    s.data_ = (char *)this;
    write<char>((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 *)CONCAT17(bVar1,in_stack_fffffffffffffff0),s,
                (format_specs *)in_stack_ffffffffffffffe8.container);
    this = extraout_RAX;
  }
  return (ssize_t)this;
}

Assistant:

void write(bool value) {
    if (specs_)
      write(string_view(value ? "true" : "false"), *specs_);
    else
      out_ = detail::write<Char>(out_, value);
  }